

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void * run(void *args_abs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  char *__s;
  int iVar8;
  wasm_extern_vec_t imports;
  wasm_extern_vec_t exports;
  wasm_extern_t *externs [2];
  wasm_val_t val;
  wasm_val_vec_t empty;
  undefined8 local_88;
  undefined8 *local_80;
  long local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar1 = wasm_store_new(*args_abs);
  uVar2 = wasm_module_obtain(uVar1,*(undefined8 *)((long)args_abs + 8));
  iVar8 = 3;
  do {
    usleep(100000);
    local_88 = wasm_valtype_new(0);
    wasm_valtype_vec_new(local_58,1,&local_88);
    wasm_valtype_vec_new_empty(&local_68);
    uVar3 = wasm_functype_new(local_58,&local_68);
    uVar4 = wasm_func_new(uVar1,uVar3,callback);
    wasm_functype_delete(uVar3);
    local_58[0] = 0;
    local_50 = *(undefined4 *)((long)args_abs + 0x10);
    uVar3 = wasm_valtype_new(0);
    uVar3 = wasm_globaltype_new(uVar3,0);
    uVar5 = wasm_global_new(uVar1,uVar3,local_58);
    wasm_globaltype_delete(uVar3);
    local_68 = wasm_func_as_extern(uVar4);
    local_60 = wasm_global_as_extern(uVar5);
    local_88 = 2;
    local_80 = &local_68;
    lVar6 = wasm_instance_new(uVar1,uVar2,&local_88,0);
    if (lVar6 == 0) {
      __s = "> Error instantiating module!";
LAB_0010260d:
      puts(__s);
      return (void *)0x0;
    }
    wasm_func_delete(uVar4);
    wasm_global_delete(uVar5);
    wasm_instance_exports(lVar6,&local_78);
    if (local_78 == 0) {
      __s = "> Error accessing exports!";
      goto LAB_0010260d;
    }
    lVar7 = wasm_extern_as_func(*local_70);
    if (lVar7 == 0) {
      __s = "> Error accessing export!";
      goto LAB_0010260d;
    }
    wasm_instance_delete(lVar6);
    local_48 = 0;
    uStack_40 = 0;
    lVar6 = wasm_func_call(lVar7,&local_48);
    if (lVar6 != 0) {
      puts("> Error calling function!");
      return (void *)0x0;
    }
    wasm_extern_vec_delete(&local_78);
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      wasm_module_delete(uVar2);
      wasm_store_delete(uVar1);
      free(args_abs);
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void* run(void* args_abs) {
  thread_args* args = (thread_args*)args_abs;

  // Rereate store and module.
  own wasm_store_t* store = wasm_store_new(args->engine);
  own wasm_module_t* module = wasm_module_obtain(store, args->module);

  // Run the example N times.
  for (int i = 0; i < N_REPS; ++i) {
    usleep(100000);

    // Create imports.
    own wasm_functype_t* func_type = wasm_functype_new_1_0(wasm_valtype_new_i32());
    own wasm_func_t* func = wasm_func_new(store, func_type, callback);
    wasm_functype_delete(func_type);

    wasm_val_t val = WASM_I32_VAL((int32_t)args->id);
    own wasm_globaltype_t* global_type =
      wasm_globaltype_new(wasm_valtype_new_i32(), WASM_CONST);
    own wasm_global_t* global = wasm_global_new(store, global_type, &val);
    wasm_globaltype_delete(global_type);

    // Instantiate.
    wasm_extern_t* externs[] = {
      wasm_func_as_extern(func), wasm_global_as_extern(global),
    };
    wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, &imports, NULL);
    if (!instance) {
      printf("> Error instantiating module!\n");
      return NULL;
    }

    wasm_func_delete(func);
    wasm_global_delete(global);

    // Extract export.
    own wasm_extern_vec_t exports;
    wasm_instance_exports(instance, &exports);
    if (exports.size == 0) {
      printf("> Error accessing exports!\n");
      return NULL;
    }
    const wasm_func_t *run_func = wasm_extern_as_func(exports.data[0]);
    if (run_func == NULL) {
      printf("> Error accessing export!\n");
      return NULL;
    }

    wasm_instance_delete(instance);

    // Call.
    wasm_val_vec_t empty = WASM_EMPTY_VEC;
    if (wasm_func_call(run_func, &empty, &empty)) {
      printf("> Error calling function!\n");
      return NULL;
    }

    wasm_extern_vec_delete(&exports);
  }

  wasm_module_delete(module);
  wasm_store_delete(store);

  free(args_abs);

  return NULL;
}